

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom
          (SoundAnalysisPreprocessing *this,SoundAnalysisPreprocessing *from)

{
  void *pvVar1;
  LogMessage *other;
  SoundAnalysisPreprocessing_Vggish *pSVar2;
  SoundAnalysisPreprocessing_Vggish *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/SoundAnalysisPreprocessing.pb.cc"
               ,400);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 0x14) {
    if (this->_oneof_case_[0] != 0x14) {
      this->_oneof_case_[0] = 0x14;
      pSVar2 = (SoundAnalysisPreprocessing_Vggish *)operator_new(0x18);
      SoundAnalysisPreprocessing_Vggish::SoundAnalysisPreprocessing_Vggish(pSVar2);
      (this->SoundAnalysisPreprocessingType_).vggish_ = pSVar2;
    }
    pSVar2 = (this->SoundAnalysisPreprocessingType_).vggish_;
    if (from->_oneof_case_[0] == 0x14) {
      from_00 = (from->SoundAnalysisPreprocessingType_).vggish_;
    }
    else {
      protobuf_SoundAnalysisPreprocessing_2eproto::InitDefaults();
      from_00 = (SoundAnalysisPreprocessing_Vggish *)
                &_SoundAnalysisPreprocessing_Vggish_default_instance_;
    }
    SoundAnalysisPreprocessing_Vggish::MergeFrom(pSVar2,from_00);
  }
  return;
}

Assistant:

void SoundAnalysisPreprocessing::MergeFrom(const SoundAnalysisPreprocessing& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.SoundAnalysisPreprocessingType_case()) {
    case kVggish: {
      mutable_vggish()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::MergeFrom(from.vggish());
      break;
    }
    case SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET: {
      break;
    }
  }
}